

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket_acceptor.hpp
# Opt level: O2

void __thiscall
asio::basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor>::
set_option<asio::detail::socket_option::boolean<1,2>>
          (basic_socket_acceptor<asio::ip::tcp,asio::any_io_executor> *this,boolean<1,_2> *option)

{
  error_code ec;
  error_code local_28;
  
  local_28._M_value = 0;
  local_28._M_cat = (error_category *)std::_V2::system_category();
  detail::reactive_socket_service<asio::ip::tcp>::
  set_option<asio::detail::socket_option::boolean<1,2>>
            (*(reactive_socket_service<asio::ip::tcp> **)this,(implementation_type *)(this + 8),
             option,&local_28);
  detail::throw_error(&local_28,"set_option");
  return;
}

Assistant:

void set_option(const SettableSocketOption& option)
  {
    asio::error_code ec;
    impl_.get_service().set_option(impl_.get_implementation(), option, ec);
    asio::detail::throw_error(ec, "set_option");
  }